

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# steal.c
# Opt level: O3

void mdrop_obj(monst *mon,obj *obj,boolean verbosely)

{
  uint uVar1;
  boolean bVar2;
  char *pcVar3;
  char *pcVar4;
  int x;
  int y;
  obj *in_stack_00000008;
  
  x = (int)mon->mx;
  y = (int)mon->my;
  uVar1 = obj->owornmask;
  if (uVar1 != 0) {
    if (mon->mhp < 1) {
      if ((((uVar1 >> 0x14 & 1) != 0) && (mon->mtame != '\0')) && ((obj->field_0x4a & 4) == 0)) {
        bVar2 = costly_spot(mon->mx,mon->my);
        if (bVar2 != '\0') {
          obj->field_0x4a = obj->field_0x4a | 8;
        }
      }
    }
    else {
      mon->misc_worn_check = mon->misc_worn_check & ~uVar1;
      update_mon_intrinsics(level,mon,obj,'\0','\x01');
      if ((obj->owornmask & 0x100) != 0) {
        setmnotwielded(mon,obj);
      }
    }
    obj->owornmask = 0;
  }
  if ((verbosely != '\0') && ((viz_array[y][x] & 2U) != 0)) {
    pcVar3 = Monnam(mon);
    pcVar4 = distant_name(obj,doname);
    pline("%s drops %s.",pcVar3,pcVar4);
  }
  bVar2 = flooreffects(obj,x,y,"fall");
  if (bVar2 != '\0') {
    return;
  }
  place_object(obj,level,x,y);
  stackobj(in_stack_00000008);
  return;
}

Assistant:

static void mdrop_obj(struct monst *mon, struct obj *obj, boolean verbosely)
{
    int omx = mon->mx, omy = mon->my;

    if (obj->owornmask) {
	/* perform worn item handling if the monster is still alive */
	if (mon->mhp > 0) {
	    mon->misc_worn_check &= ~obj->owornmask;
	    update_mon_intrinsics(level, mon, obj, FALSE, TRUE);
	 /* obj_no_longer_held(obj); -- done by place_object */
	    if (obj->owornmask & W_WEP) setmnotwielded(mon, obj);
	/* don't charge for an owned saddle on dead steed */
	} else if (mon->mtame && (obj->owornmask & W_SADDLE) && 
		!obj->unpaid && costly_spot(omx, omy)) {
	    obj->no_charge = 1;
	}
	obj->owornmask = 0L;
    }
    if (verbosely && cansee(omx, omy))
	pline("%s drops %s.", Monnam(mon), distant_name(obj, doname));
    if (!flooreffects(obj, omx, omy, "fall")) {
	place_object(obj, level, omx, omy);
	stackobj(obj);
    }
}